

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest_ComparatorCheck_Test::TestBody(DBTest_ComparatorCheck_Test *this)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  Message *message;
  char *in_R9;
  string local_158;
  AssertHelper local_138;
  string local_130;
  Message local_110;
  string local_108;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  Status s;
  Options new_options;
  NewComparator cmp;
  DBTest_ComparatorCheck_Test *this_local;
  
  TestBody::NewComparator::NewComparator((NewComparator *)&new_options.filter_policy);
  DBTest::CurrentOptions((Options *)&s,&this->super_DBTest);
  s.state_ = (char *)&new_options.filter_policy;
  DBTest::TryReopen((DBTest *)&gtest_ar_.message_,(Options *)this);
  bVar1 = Status::ok((Status *)&gtest_ar_.message_);
  local_91 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_90,(AssertionResult *)"!s.ok()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x5f7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    Status::ToString_abi_cxx11_(&local_108,(Status *)&gtest_ar_.message_);
    lVar3 = std::__cxx11::string::find((char *)&local_108,0x1d63f5);
    local_e1 = lVar3 != -1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_e0,&local_e1,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      Status::ToString_abi_cxx11_(&local_130,(Status *)&gtest_ar_.message_);
      message = testing::Message::operator<<(&local_110,&local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)local_e0,
                 (AssertionResult *)"s.ToString().find(\"comparator\") != std::string::npos","false"
                 ,"true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x5f8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_138,message);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_130);
      testing::Message::~Message(&local_110);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  Status::~Status((Status *)&gtest_ar_.message_);
  TestBody::NewComparator::~NewComparator((NewComparator *)&new_options.filter_policy);
  return;
}

Assistant:

TEST_F(DBTest, ComparatorCheck) {
  class NewComparator : public Comparator {
   public:
    const char* Name() const override { return "leveldb.NewComparator"; }
    int Compare(const Slice& a, const Slice& b) const override {
      return BytewiseComparator()->Compare(a, b);
    }
    void FindShortestSeparator(std::string* s, const Slice& l) const override {
      BytewiseComparator()->FindShortestSeparator(s, l);
    }
    void FindShortSuccessor(std::string* key) const override {
      BytewiseComparator()->FindShortSuccessor(key);
    }
  };
  NewComparator cmp;
  Options new_options = CurrentOptions();
  new_options.comparator = &cmp;
  Status s = TryReopen(&new_options);
  ASSERT_TRUE(!s.ok());
  ASSERT_TRUE(s.ToString().find("comparator") != std::string::npos)
      << s.ToString();
}